

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  float fVar75;
  undefined1 auVar74 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  uint uVar83;
  uint uVar84;
  uint uVar85;
  undefined1 auVar82 [64];
  undefined1 auVar86 [64];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  int local_149c;
  undefined1 local_1498 [16];
  RayQueryContext *local_1480;
  undefined1 local_1478 [16];
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  int *local_13d8;
  undefined8 local_13d0;
  RTCRayQueryContext *local_13c8;
  Ray *local_13c0;
  undefined4 *local_13b8;
  undefined4 local_13b0;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar49 = ray->tfar;
    if (0.0 <= fVar49) {
      local_1480 = context;
      aVar3 = (ray->dir).field_0;
      auVar50 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar73._8_4_ = 0x7fffffff;
      auVar73._0_8_ = 0x7fffffff7fffffff;
      auVar73._12_4_ = 0x7fffffff;
      auVar73 = vandps_avx((undefined1  [16])aVar3,auVar73);
      auVar76._8_4_ = 0x219392ef;
      auVar76._0_8_ = 0x219392ef219392ef;
      auVar76._12_4_ = 0x219392ef;
      auVar73 = vcmpps_avx(auVar73,auVar76,1);
      auVar73 = vblendvps_avx((undefined1  [16])aVar3,auVar76,auVar73);
      local_1410 = local_11d8 + 1;
      auVar76 = vrcpps_avx(auVar73);
      fVar52 = auVar76._0_4_;
      auVar70._0_4_ = fVar52 * auVar73._0_4_;
      fVar53 = auVar76._4_4_;
      auVar70._4_4_ = fVar53 * auVar73._4_4_;
      fVar54 = auVar76._8_4_;
      auVar70._8_4_ = fVar54 * auVar73._8_4_;
      fVar75 = auVar76._12_4_;
      auVar70._12_4_ = fVar75 * auVar73._12_4_;
      auVar77._8_4_ = 0x3f800000;
      auVar77._0_8_ = 0x3f8000003f800000;
      auVar77._12_4_ = 0x3f800000;
      auVar73 = vsubps_avx(auVar77,auVar70);
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar2;
      local_11f8._0_4_ = uVar2;
      local_11f8._8_4_ = uVar2;
      local_11f8._12_4_ = uVar2;
      local_11f8._16_4_ = uVar2;
      local_11f8._20_4_ = uVar2;
      local_11f8._24_4_ = uVar2;
      local_11f8._28_4_ = uVar2;
      auVar79 = ZEXT3264(local_11f8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar2;
      local_1218._0_4_ = uVar2;
      local_1218._8_4_ = uVar2;
      local_1218._12_4_ = uVar2;
      local_1218._16_4_ = uVar2;
      local_1218._20_4_ = uVar2;
      local_1218._24_4_ = uVar2;
      local_1218._28_4_ = uVar2;
      auVar80 = ZEXT3264(local_1218);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar2;
      local_1238._0_4_ = uVar2;
      local_1238._8_4_ = uVar2;
      local_1238._12_4_ = uVar2;
      local_1238._16_4_ = uVar2;
      local_1238._20_4_ = uVar2;
      local_1238._24_4_ = uVar2;
      local_1238._28_4_ = uVar2;
      auVar81 = ZEXT3264(local_1238);
      auVar71._0_4_ = fVar52 + fVar52 * auVar73._0_4_;
      auVar71._4_4_ = fVar53 + fVar53 * auVar73._4_4_;
      auVar71._8_4_ = fVar54 + fVar54 * auVar73._8_4_;
      auVar71._12_4_ = fVar75 + fVar75 * auVar73._12_4_;
      auVar73 = vshufps_avx(auVar71,auVar71,0);
      local_1258._16_16_ = auVar73;
      local_1258._0_16_ = auVar73;
      auVar82 = ZEXT3264(local_1258);
      auVar73 = vmovshdup_avx(auVar71);
      auVar76 = vshufps_avx(auVar71,auVar71,0x55);
      local_1278._16_16_ = auVar76;
      local_1278._0_16_ = auVar76;
      auVar86 = ZEXT3264(local_1278);
      auVar76 = vshufpd_avx(auVar71,auVar71,1);
      auVar70 = vshufps_avx(auVar71,auVar71,0xaa);
      local_1298._16_16_ = auVar70;
      local_1298._0_16_ = auVar70;
      auVar72 = ZEXT3264(local_1298);
      local_1418 = (ulong)(auVar71._0_4_ < 0.0) << 5;
      uVar46 = (ulong)(auVar73._0_4_ < 0.0) << 5 | 0x40;
      uVar45 = (ulong)(auVar76._0_4_ < 0.0) << 5 | 0x80;
      uVar47 = local_1418 ^ 0x20;
      auVar73 = vshufps_avx(auVar50,auVar50,0);
      local_12b8._16_16_ = auVar73;
      local_12b8._0_16_ = auVar73;
      auVar74 = ZEXT3264(local_12b8);
      auVar73 = vshufps_avx(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49),0);
      local_12d8._16_16_ = auVar73;
      local_12d8._0_16_ = auVar73;
      auVar78 = ZEXT3264(local_12d8);
      local_13a8 = mm_lookupmask_ps._240_16_;
LAB_00e53253:
      if (local_1410 != local_11d8) {
        uVar48 = local_1410[-1];
        local_1410 = local_1410 + -1;
        while ((uVar48 & 8) == 0) {
          auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + local_1418),auVar79._0_32_);
          auVar15._4_4_ = auVar82._4_4_ * auVar14._4_4_;
          auVar15._0_4_ = auVar82._0_4_ * auVar14._0_4_;
          auVar15._8_4_ = auVar82._8_4_ * auVar14._8_4_;
          auVar15._12_4_ = auVar82._12_4_ * auVar14._12_4_;
          auVar15._16_4_ = auVar82._16_4_ * auVar14._16_4_;
          auVar15._20_4_ = auVar82._20_4_ * auVar14._20_4_;
          auVar15._24_4_ = auVar82._24_4_ * auVar14._24_4_;
          auVar15._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar46),auVar80._0_32_);
          auVar16._4_4_ = auVar86._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = auVar86._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = auVar86._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = auVar86._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = auVar86._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = auVar86._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = auVar86._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar14 = vmaxps_avx(auVar15,auVar16);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar45),auVar81._0_32_);
          auVar17._4_4_ = auVar72._4_4_ * auVar15._4_4_;
          auVar17._0_4_ = auVar72._0_4_ * auVar15._0_4_;
          auVar17._8_4_ = auVar72._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar72._12_4_ * auVar15._12_4_;
          auVar17._16_4_ = auVar72._16_4_ * auVar15._16_4_;
          auVar17._20_4_ = auVar72._20_4_ * auVar15._20_4_;
          auVar17._24_4_ = auVar72._24_4_ * auVar15._24_4_;
          auVar17._28_4_ = auVar15._28_4_;
          auVar15 = vmaxps_avx(auVar17,auVar74._0_32_);
          auVar14 = vmaxps_avx(auVar14,auVar15);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar47),auVar79._0_32_);
          auVar18._4_4_ = auVar82._4_4_ * auVar15._4_4_;
          auVar18._0_4_ = auVar82._0_4_ * auVar15._0_4_;
          auVar18._8_4_ = auVar82._8_4_ * auVar15._8_4_;
          auVar18._12_4_ = auVar82._12_4_ * auVar15._12_4_;
          auVar18._16_4_ = auVar82._16_4_ * auVar15._16_4_;
          auVar18._20_4_ = auVar82._20_4_ * auVar15._20_4_;
          auVar18._24_4_ = auVar82._24_4_ * auVar15._24_4_;
          auVar18._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + (uVar46 ^ 0x20)),
                               auVar80._0_32_);
          auVar19._4_4_ = auVar86._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = auVar86._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = auVar86._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar86._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = auVar86._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = auVar86._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = auVar86._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar18,auVar19);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + (uVar45 ^ 0x20)),
                               auVar81._0_32_);
          auVar20._4_4_ = auVar72._4_4_ * auVar16._4_4_;
          auVar20._0_4_ = auVar72._0_4_ * auVar16._0_4_;
          auVar20._8_4_ = auVar72._8_4_ * auVar16._8_4_;
          auVar20._12_4_ = auVar72._12_4_ * auVar16._12_4_;
          auVar20._16_4_ = auVar72._16_4_ * auVar16._16_4_;
          auVar20._20_4_ = auVar72._20_4_ * auVar16._20_4_;
          auVar20._24_4_ = auVar72._24_4_ * auVar16._24_4_;
          auVar20._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar20,auVar78._0_32_);
          auVar15 = vminps_avx(auVar15,auVar16);
          auVar14 = vcmpps_avx(auVar14,auVar15,2);
          uVar41 = vmovmskps_avx(auVar14);
          if (uVar41 == 0) goto LAB_00e53253;
          uVar41 = uVar41 & 0xff;
          uVar42 = uVar48 & 0xfffffffffffffff0;
          lVar44 = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
            }
          }
          uVar48 = *(ulong *)(uVar42 + lVar44 * 8);
          uVar41 = uVar41 - 1 & uVar41;
          uVar43 = (ulong)uVar41;
          if (uVar41 != 0) {
            do {
              *local_1410 = uVar48;
              local_1410 = local_1410 + 1;
              lVar44 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                }
              }
              uVar48 = *(ulong *)(uVar42 + lVar44 * 8);
              uVar43 = uVar43 - 1 & uVar43;
            } while (uVar43 != 0);
          }
        }
        local_1420 = (ulong)((uint)uVar48 & 0xf) - 8;
        uVar48 = uVar48 & 0xfffffffffffffff0;
        for (local_1428 = 0; local_1428 != local_1420; local_1428 = local_1428 + 1) {
          lVar44 = local_1428 * 0xb0;
          pfVar1 = (float *)(uVar48 + 0x80 + lVar44);
          fVar21 = *pfVar1;
          fVar22 = pfVar1[1];
          fVar23 = pfVar1[2];
          fVar24 = pfVar1[3];
          pfVar1 = (float *)(uVar48 + 0x40 + lVar44);
          fVar25 = *pfVar1;
          fVar26 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          auVar50._0_4_ = fVar21 * fVar25;
          auVar50._4_4_ = fVar22 * fVar26;
          auVar50._8_4_ = fVar23 * fVar27;
          auVar50._12_4_ = fVar24 * fVar28;
          pfVar1 = (float *)(uVar48 + 0x70 + lVar44);
          fVar29 = *pfVar1;
          fVar30 = pfVar1[1];
          fVar31 = pfVar1[2];
          fVar32 = pfVar1[3];
          pfVar1 = (float *)(uVar48 + 0x50 + lVar44);
          fVar33 = *pfVar1;
          fVar34 = pfVar1[1];
          fVar35 = pfVar1[2];
          fVar36 = pfVar1[3];
          auVar55._0_4_ = fVar29 * fVar33;
          auVar55._4_4_ = fVar30 * fVar34;
          auVar55._8_4_ = fVar31 * fVar35;
          auVar55._12_4_ = fVar32 * fVar36;
          local_1448 = vsubps_avx(auVar55,auVar50);
          auVar73 = *(undefined1 (*) [16])(uVar48 + 0x60 + lVar44);
          fVar87 = auVar73._0_4_;
          auVar56._0_4_ = fVar87 * fVar33;
          fVar88 = auVar73._4_4_;
          auVar56._4_4_ = fVar88 * fVar34;
          fVar89 = auVar73._8_4_;
          auVar56._8_4_ = fVar89 * fVar35;
          fVar90 = auVar73._12_4_;
          auVar56._12_4_ = fVar90 * fVar36;
          pfVar1 = (float *)(uVar48 + 0x30 + lVar44);
          fVar37 = *pfVar1;
          fVar38 = pfVar1[1];
          fVar39 = pfVar1[2];
          fVar40 = pfVar1[3];
          auVar64._0_4_ = fVar21 * fVar37;
          auVar64._4_4_ = fVar22 * fVar38;
          auVar64._8_4_ = fVar23 * fVar39;
          auVar64._12_4_ = fVar24 * fVar40;
          local_1498 = vsubps_avx(auVar64,auVar56);
          auVar65._0_4_ = fVar29 * fVar37;
          auVar65._4_4_ = fVar30 * fVar38;
          auVar65._8_4_ = fVar31 * fVar39;
          auVar65._12_4_ = fVar32 * fVar40;
          auVar91._0_4_ = fVar87 * fVar25;
          auVar91._4_4_ = fVar88 * fVar26;
          auVar91._8_4_ = fVar89 * fVar27;
          auVar91._12_4_ = fVar90 * fVar28;
          auVar76 = vsubps_avx(auVar91,auVar65);
          uVar2 = *(undefined4 *)&(ray->org).field_0;
          auVar92._4_4_ = uVar2;
          auVar92._0_4_ = uVar2;
          auVar92._8_4_ = uVar2;
          auVar92._12_4_ = uVar2;
          local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + lVar44),auVar92);
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar93._4_4_ = uVar2;
          auVar93._0_4_ = uVar2;
          auVar93._8_4_ = uVar2;
          auVar93._12_4_ = uVar2;
          local_1458 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x10 + lVar44),auVar93);
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar94._4_4_ = uVar2;
          auVar94._0_4_ = uVar2;
          auVar94._8_4_ = uVar2;
          auVar94._12_4_ = uVar2;
          local_1478 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + lVar44),auVar94);
          fVar49 = (ray->dir).field_0.m128[1];
          fVar52 = (ray->dir).field_0.m128[2];
          fVar54 = local_1478._0_4_;
          auVar95._0_4_ = fVar49 * fVar54;
          fVar5 = local_1478._4_4_;
          auVar95._4_4_ = fVar49 * fVar5;
          fVar8 = local_1478._8_4_;
          auVar95._8_4_ = fVar49 * fVar8;
          fVar11 = local_1478._12_4_;
          auVar95._12_4_ = fVar49 * fVar11;
          fVar75 = local_1458._0_4_;
          auVar96._0_4_ = fVar52 * fVar75;
          fVar6 = local_1458._4_4_;
          auVar96._4_4_ = fVar52 * fVar6;
          fVar9 = local_1458._8_4_;
          auVar96._8_4_ = fVar52 * fVar9;
          fVar12 = local_1458._12_4_;
          auVar96._12_4_ = fVar52 * fVar12;
          auVar50 = vsubps_avx(auVar96,auVar95);
          fVar53 = (ray->dir).field_0.m128[0];
          fVar4 = local_1468._0_4_;
          auVar51._0_4_ = fVar52 * fVar4;
          fVar7 = local_1468._4_4_;
          auVar51._4_4_ = fVar52 * fVar7;
          fVar10 = local_1468._8_4_;
          auVar51._8_4_ = fVar52 * fVar10;
          fVar13 = local_1468._12_4_;
          auVar51._12_4_ = fVar52 * fVar13;
          auVar57._0_4_ = fVar53 * fVar54;
          auVar57._4_4_ = fVar53 * fVar5;
          auVar57._8_4_ = fVar53 * fVar8;
          auVar57._12_4_ = fVar53 * fVar11;
          auVar70 = vsubps_avx(auVar57,auVar51);
          auVar58._0_4_ = fVar53 * fVar75;
          auVar58._4_4_ = fVar53 * fVar6;
          auVar58._8_4_ = fVar53 * fVar9;
          auVar58._12_4_ = fVar53 * fVar12;
          auVar66._0_4_ = fVar49 * fVar4;
          auVar66._4_4_ = fVar49 * fVar7;
          auVar66._8_4_ = fVar49 * fVar10;
          auVar66._12_4_ = fVar49 * fVar13;
          auVar71 = vsubps_avx(auVar66,auVar58);
          auVar77 = local_1498;
          auVar67._0_4_ =
               local_1448._0_4_ * fVar53 + fVar49 * local_1498._0_4_ + fVar52 * auVar76._0_4_;
          auVar67._4_4_ =
               local_1448._4_4_ * fVar53 + fVar49 * local_1498._4_4_ + fVar52 * auVar76._4_4_;
          auVar67._8_4_ =
               local_1448._8_4_ * fVar53 + fVar49 * local_1498._8_4_ + fVar52 * auVar76._8_4_;
          auVar67._12_4_ =
               local_1448._12_4_ * fVar53 + fVar49 * local_1498._12_4_ + fVar52 * auVar76._12_4_;
          auVar59._8_8_ = 0x8000000080000000;
          auVar59._0_8_ = 0x8000000080000000;
          auVar73 = vandps_avx(auVar67,auVar59);
          uVar41 = auVar73._0_4_;
          local_1398._0_4_ =
               (float)(uVar41 ^ (uint)(fVar87 * auVar50._0_4_ +
                                      fVar21 * auVar71._0_4_ + fVar29 * auVar70._0_4_));
          uVar83 = auVar73._4_4_;
          local_1398._4_4_ =
               (float)(uVar83 ^ (uint)(fVar88 * auVar50._4_4_ +
                                      fVar22 * auVar71._4_4_ + fVar30 * auVar70._4_4_));
          uVar84 = auVar73._8_4_;
          local_1398._8_4_ =
               (float)(uVar84 ^ (uint)(fVar89 * auVar50._8_4_ +
                                      fVar23 * auVar71._8_4_ + fVar31 * auVar70._8_4_));
          uVar85 = auVar73._12_4_;
          local_1398._12_4_ =
               (float)(uVar85 ^ (uint)(fVar90 * auVar50._12_4_ +
                                      fVar24 * auVar71._12_4_ + fVar32 * auVar70._12_4_));
          local_1388._0_4_ =
               (float)(uVar41 ^ (uint)(fVar37 * auVar50._0_4_ +
                                      fVar33 * auVar71._0_4_ + fVar25 * auVar70._0_4_));
          local_1388._4_4_ =
               (float)(uVar83 ^ (uint)(fVar38 * auVar50._4_4_ +
                                      fVar34 * auVar71._4_4_ + fVar26 * auVar70._4_4_));
          local_1388._8_4_ =
               (float)(uVar84 ^ (uint)(fVar39 * auVar50._8_4_ +
                                      fVar35 * auVar71._8_4_ + fVar27 * auVar70._8_4_));
          local_1388._12_4_ =
               (float)(uVar85 ^ (uint)(fVar40 * auVar50._12_4_ +
                                      fVar36 * auVar71._12_4_ + fVar28 * auVar70._12_4_));
          auVar70 = ZEXT416(0) << 0x20;
          auVar73 = vcmpps_avx(local_1398,auVar70,5);
          auVar50 = vcmpps_avx(local_1388,auVar70,5);
          auVar73 = vandps_avx(auVar73,auVar50);
          auVar60._8_4_ = 0x7fffffff;
          auVar60._0_8_ = 0x7fffffff7fffffff;
          auVar60._12_4_ = 0x7fffffff;
          local_1368 = vandps_avx(auVar67,auVar60);
          auVar50 = vcmpps_avx(auVar70,auVar67,4);
          auVar73 = vandps_avx(auVar73,auVar50);
          auVar61._0_4_ = local_1398._0_4_ + local_1388._0_4_;
          auVar61._4_4_ = local_1398._4_4_ + local_1388._4_4_;
          auVar61._8_4_ = local_1398._8_4_ + local_1388._8_4_;
          auVar61._12_4_ = local_1398._12_4_ + local_1388._12_4_;
          auVar50 = vcmpps_avx(auVar61,local_1368,2);
          auVar73 = vandps_avx(auVar73,auVar50);
          auVar50 = local_13a8 & auVar73;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar73 = vandps_avx(auVar73,local_13a8);
            local_1378._0_4_ =
                 (float)(uVar41 ^ (uint)(local_1448._0_4_ * fVar4 +
                                        fVar75 * local_1498._0_4_ + fVar54 * auVar76._0_4_));
            local_1378._4_4_ =
                 (float)(uVar83 ^ (uint)(local_1448._4_4_ * fVar7 +
                                        fVar6 * local_1498._4_4_ + fVar5 * auVar76._4_4_));
            local_1378._8_4_ =
                 (float)(uVar84 ^ (uint)(local_1448._8_4_ * fVar10 +
                                        fVar9 * local_1498._8_4_ + fVar8 * auVar76._8_4_));
            local_1378._12_4_ =
                 (float)(uVar85 ^ (uint)(local_1448._12_4_ * fVar13 +
                                        fVar12 * local_1498._12_4_ + fVar11 * auVar76._12_4_));
            fVar49 = (ray->org).field_0.m128[3];
            fVar52 = local_1368._0_4_;
            auVar62._0_4_ = fVar52 * fVar49;
            fVar53 = local_1368._4_4_;
            auVar62._4_4_ = fVar53 * fVar49;
            fVar54 = local_1368._8_4_;
            auVar62._8_4_ = fVar54 * fVar49;
            fVar75 = local_1368._12_4_;
            auVar62._12_4_ = fVar75 * fVar49;
            auVar50 = vcmpps_avx(auVar62,local_1378,1);
            fVar49 = ray->tfar;
            auVar68._0_4_ = fVar52 * fVar49;
            auVar68._4_4_ = fVar53 * fVar49;
            auVar68._8_4_ = fVar54 * fVar49;
            auVar68._12_4_ = fVar75 * fVar49;
            auVar70 = vcmpps_avx(local_1378,auVar68,2);
            auVar50 = vandps_avx(auVar70,auVar50);
            local_1348 = vandps_avx(auVar50,auVar73);
            uVar41 = vmovmskps_avx(local_1348);
            if (uVar41 != 0) {
              local_1308 = local_1448;
              local_12f8 = local_1498._0_8_;
              uStack_12f0 = local_1498._8_8_;
              local_14b8 = auVar76._0_8_;
              uStack_14b0 = auVar76._8_8_;
              local_12e8 = local_14b8;
              uStack_12e0 = uStack_14b0;
              local_1448._0_8_ = local_1480->scene;
              auVar73 = vrcpps_avx(local_1368);
              fVar49 = auVar73._0_4_;
              auVar63._0_4_ = fVar52 * fVar49;
              fVar52 = auVar73._4_4_;
              auVar63._4_4_ = fVar53 * fVar52;
              fVar53 = auVar73._8_4_;
              auVar63._8_4_ = fVar54 * fVar53;
              fVar54 = auVar73._12_4_;
              auVar63._12_4_ = fVar75 * fVar54;
              auVar69._8_4_ = 0x3f800000;
              auVar69._0_8_ = 0x3f8000003f800000;
              auVar69._12_4_ = 0x3f800000;
              auVar73 = vsubps_avx(auVar69,auVar63);
              fVar49 = fVar49 + fVar49 * auVar73._0_4_;
              fVar52 = fVar52 + fVar52 * auVar73._4_4_;
              fVar53 = fVar53 + fVar53 * auVar73._8_4_;
              fVar54 = fVar54 + fVar54 * auVar73._12_4_;
              local_1318[0] = fVar49 * local_1378._0_4_;
              local_1318[1] = fVar52 * local_1378._4_4_;
              local_1318[2] = fVar53 * local_1378._8_4_;
              local_1318[3] = fVar54 * local_1378._12_4_;
              local_1338._0_4_ = fVar49 * local_1398._0_4_;
              local_1338._4_4_ = fVar52 * local_1398._4_4_;
              local_1338._8_4_ = fVar53 * local_1398._8_4_;
              local_1338._12_4_ = fVar54 * local_1398._12_4_;
              local_1328._0_4_ = fVar49 * local_1388._0_4_;
              local_1328._4_4_ = fVar52 * local_1388._4_4_;
              local_1328._8_4_ = fVar53 * local_1388._8_4_;
              local_1328._12_4_ = fVar54 * local_1388._12_4_;
              uVar42 = (ulong)(uVar41 & 0xff);
              local_1468._0_8_ = lVar44 + uVar48;
              lVar44 = lVar44 + uVar48;
              local_1498 = auVar77;
              do {
                uVar43 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                local_1498._0_8_ = uVar43;
                local_13f0 = *(uint *)(lVar44 + 0x90 + uVar43 * 4);
                local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + (ulong)local_13f0 * 8);
                if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
                  uVar42 = uVar42 ^ 1L << (uVar43 & 0x3f);
                }
                else {
                  local_1458._0_8_ = uVar42;
                  if ((local_1480->args->filter == (RTCFilterFunctionN)0x0) &&
                     (*(long *)(local_1430 + 0x48) == 0)) {
LAB_00e538b7:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_1478._0_8_ = local_1480->args;
                  local_13c8 = local_1480->user;
                  local_1408 = *(undefined4 *)(local_1308 + uVar43 * 4);
                  local_1404 = *(undefined4 *)((long)&local_12f8 + uVar43 * 4);
                  local_1400 = *(undefined4 *)((long)&local_12e8 + uVar43 * 4);
                  local_13fc = *(undefined4 *)(local_1338 + uVar43 * 4);
                  local_13f8 = *(undefined4 *)(local_1328 + uVar43 * 4);
                  local_13f4 = *(undefined4 *)(local_1468._0_8_ + 0xa0 + uVar43 * 4);
                  local_13ec = local_13c8->instID[0];
                  local_13e8 = local_13c8->instPrimID[0];
                  fVar49 = ray->tfar;
                  ray->tfar = local_1318[uVar43];
                  local_149c = -1;
                  local_13d8 = &local_149c;
                  local_13d0 = *(undefined8 *)(local_1430 + 0x18);
                  local_13b8 = &local_1408;
                  local_13b0 = 1;
                  local_13c0 = ray;
                  if ((*(code **)(local_1430 + 0x48) == (code *)0x0) ||
                     ((**(code **)(local_1430 + 0x48))(&local_13d8), *local_13d8 != 0)) {
                    if ((*(code **)(local_1478._0_8_ + 0x10) == (code *)0x0) ||
                       ((((*(byte *)local_1478._0_8_ & 2) == 0 &&
                         ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)) ||
                        ((**(code **)(local_1478._0_8_ + 0x10))(&local_13d8), *local_13d8 != 0))))
                    goto LAB_00e538b7;
                  }
                  ray->tfar = fVar49;
                  uVar42 = local_1458._0_8_ ^ 1L << (local_1498._0_8_ & 0x3f);
                }
                lVar44 = local_1468._0_8_;
              } while (uVar42 != 0);
            }
          }
          auVar79 = ZEXT3264(local_11f8);
          auVar80 = ZEXT3264(local_1218);
          auVar81 = ZEXT3264(local_1238);
          auVar82 = ZEXT3264(local_1258);
          auVar86 = ZEXT3264(local_1278);
          auVar72 = ZEXT3264(local_1298);
          auVar74 = ZEXT3264(local_12b8);
          auVar78 = ZEXT3264(local_12d8);
        }
        goto LAB_00e53253;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }